

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * __thiscall
kj::_::Debug::makeDescription<unsigned_int&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,StringPtr *params)

{
  size_t in_R8;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> argValues_00;
  ArrayDisposer **local_90;
  undefined1 local_38 [8];
  String argValues [1];
  StringPtr *params_local;
  char *macroArgs_local;
  
  argValues[0].content.disposer = (ArrayDisposer *)macroArgs;
  str<unsigned_int&>((String *)local_38,(kj *)macroArgs,(uint *)macroArgs);
  AVar1 = arrayPtr<kj::String>((String *)local_38,1);
  argValues_00.size_ = in_R8;
  argValues_00.ptr = (String *)AVar1.size_;
  makeDescriptionInternal(__return_storage_ptr__,this,(char *)AVar1.ptr,argValues_00);
  local_90 = &argValues[0].content.disposer;
  do {
    local_90 = local_90 + -3;
    String::~String((String *)local_90);
  } while (local_90 != (ArrayDisposer **)local_38);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}